

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *__s;
  ulong uVar4;
  
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    uVar4 = 0;
    do {
      uVar1 = pipes[uVar4][1];
      if ((int)uVar1 < 0) {
        if (uVar4 < 3) {
          uVar1 = open("/dev/null",(uint)(uVar4 != 0) * 2);
          if (uVar1 != 0xffffffff) goto LAB_0010dc14;
          piVar3 = __errno_location();
          uv__write_int(error_fd,-*piVar3);
          __s = "failed to open stdio";
          goto LAB_0010dd30;
        }
      }
      else {
        if (pipes[uVar4][0] != -1) {
          uv__close(pipes[uVar4][0]);
        }
LAB_0010dc14:
        if (uVar4 == uVar1) {
          uv__cloexec(uVar1,0);
        }
        else {
          dup2(uVar1,(int)uVar4);
          uv__close(uVar1);
        }
        if (uVar4 < 3) {
          uv__nonblock((int)uVar4,0);
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)stdio_count != uVar4);
  }
  if (options->cwd != (char *)0x0) {
    iVar2 = chdir(options->cwd);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      uv__write_int(error_fd,-*piVar3);
      __s = "chdir()";
      goto LAB_0010dd30;
    }
  }
  uVar1 = options->flags;
  if ((uVar1 & 2) != 0) {
    iVar2 = setgid(options->gid);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      uv__write_int(error_fd,-*piVar3);
      __s = "setgid()";
      goto LAB_0010dd30;
    }
    uVar1 = options->flags;
  }
  if ((uVar1 & 1) != 0) {
    iVar2 = setuid(options->uid);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      uv__write_int(error_fd,-*piVar3);
      __s = "setuid()";
      goto LAB_0010dd30;
    }
  }
  if (options->env != (char **)0x0) {
    _environ = options->env;
  }
  execvp(options->file,options->args);
  piVar3 = __errno_location();
  uv__write_int(error_fd,-*piVar3);
  __s = "execvp()";
LAB_0010dd30:
  perror(__s);
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  int close_fd;
  int use_fd;
  int fd;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd >= 0) {
      if (close_fd != -1)
        uv__close(close_fd);
    }
    else if (fd >= 3)
      continue;
    else {
      /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
       * set
       */
      use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);

      if (use_fd == -1) {
        uv__write_int(error_fd, -errno);
        perror("failed to open stdio");
        _exit(127);
      }
    }

    if (fd == use_fd)
      uv__cloexec(use_fd, 0);
    else {
      dup2(use_fd, fd);
      uv__close(use_fd);
    }

    if (fd <= 2)
      uv__nonblock(fd, 0);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, -errno);
    perror("chdir()");
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, -errno);
    perror("setgid()");
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, -errno);
    perror("setuid()");
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, -errno);
  perror("execvp()");
  _exit(127);
}